

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::commandsBeforeCompute
          (BinaryAtomicIntermValuesInstance *this,VkCommandBuffer cmdBuffer)

{
  VkImageSubresourceRange subresourceRange_00;
  deUint32 layerCount;
  DeviceInterface *pDVar1;
  Image *this_00;
  VkImage *pVVar2;
  undefined1 local_80 [8];
  VkImageMemoryBarrier imagePreDispatchBarrier;
  undefined4 uStack_30;
  VkImageSubresourceRange subresourceRange;
  DeviceInterface *deviceInterface;
  VkCommandBuffer cmdBuffer_local;
  BinaryAtomicIntermValuesInstance *this_local;
  
  pDVar1 = Context::getDeviceInterface
                     ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  layerCount = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,
                            &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&imagePreDispatchBarrier.field_0x44,1,0,1,0,layerCount);
  this_00 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator->(&(this->m_intermResultsImage).
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
  ;
  pVVar2 = image::Image::get(this_00);
  subresourceRange_00.levelCount = subresourceRange.aspectMask;
  subresourceRange_00.aspectMask = imagePreDispatchBarrier._68_4_;
  subresourceRange_00.baseMipLevel = uStack_30;
  subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_80,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_GENERAL,(VkImage)pVVar2->m_internal,subresourceRange_00);
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,1,0x800,0,0,0,0,0,1,local_80);
  return;
}

Assistant:

void BinaryAtomicIntermValuesInstance::commandsBeforeCompute (const VkCommandBuffer cmdBuffer) const
{
	const DeviceInterface&			deviceInterface		= m_context.getDeviceInterface();
	const VkImageSubresourceRange	subresourceRange	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	const VkImageMemoryBarrier	imagePreDispatchBarrier =
		makeImageMemoryBarrier(	0u,
								VK_ACCESS_SHADER_WRITE_BIT,
								VK_IMAGE_LAYOUT_UNDEFINED,
								VK_IMAGE_LAYOUT_GENERAL,
								m_intermResultsImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, DE_FALSE, 0u, DE_NULL, 0u, DE_NULL, 1u, &imagePreDispatchBarrier);
}